

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O0

Ivy_Obj_t * Ivy_ObjChild1Equiv(Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *local_18;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 == 0) {
    pIVar2 = Ivy_ObjFanin1(pObj);
    if (pIVar2 == (Ivy_Obj_t *)0x0) {
      local_18 = (Ivy_Obj_t *)0x0;
    }
    else {
      pIVar2 = Ivy_ObjFanin1(pObj);
      pIVar2 = pIVar2->pEquiv;
      iVar1 = Ivy_ObjFaninC1(pObj);
      local_18 = Ivy_NotCond(pIVar2,iVar1);
    }
    return local_18;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                ,0x114,"Ivy_Obj_t *Ivy_ObjChild1Equiv(Ivy_Obj_t *)");
}

Assistant:

static inline Ivy_Obj_t *  Ivy_ObjChild1Equiv( Ivy_Obj_t * pObj ) { assert( !Ivy_IsComplement(pObj) ); return Ivy_ObjFanin1(pObj)? Ivy_NotCond(Ivy_ObjFanin1(pObj)->pEquiv, Ivy_ObjFaninC1(pObj)) : NULL;  }